

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZOneShapeRestraint.h
# Opt level: O0

void __thiscall TPZOneShapeRestraint::Print(TPZOneShapeRestraint *this,ostream *out)

{
  pair<long,_int> *ppVar1;
  ostream *poVar2;
  int *piVar3;
  ostream *in_RSI;
  TPZVec<std::pair<long,_int>_> *in_RDI;
  int i_1;
  int i;
  int local_18;
  int local_14;
  
  std::operator<<(in_RSI,"TPZOneShapeRestraint ConnectIndex/Degree of freedom : ");
  for (local_14 = 0; local_14 < 4; local_14 = local_14 + 1) {
    ppVar1 = TPZVec<std::pair<long,_int>_>::operator[](in_RDI,(long)local_14);
    poVar2 = (ostream *)std::ostream::operator<<(in_RSI,ppVar1->first);
    poVar2 = std::operator<<(poVar2,"/");
    ppVar1 = TPZVec<std::pair<long,_int>_>::operator[](in_RDI,(long)local_14);
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,ppVar1->second);
    std::operator<<(poVar2," ");
  }
  std::ostream::operator<<(in_RSI,std::endl<char,std::char_traits<char>>);
  std::operator<<(in_RSI,"Orientation of each face ");
  for (local_18 = 0; local_18 < 4; local_18 = local_18 + 1) {
    piVar3 = TPZVec<int>::operator[]((TPZVec<int> *)(in_RDI + 3),(long)local_18);
    poVar2 = (ostream *)std::ostream::operator<<(in_RSI,*piVar3);
    std::operator<<(poVar2," ");
  }
  std::ostream::operator<<(in_RSI,std::endl<char,std::char_traits<char>>);
  return;
}

Assistant:

void Print(std::ostream &out) const
    {
        out << "TPZOneShapeRestraint ConnectIndex/Degree of freedom : ";
        for(int i=0; i<4; i++) out << fFaces[i].first << "/" << fFaces[i].second << " ";
        out << std::endl;
        out << "Orientation of each face ";
        for(int i=0; i<4; i++) out << fOrient[i] << " ";
        out << std::endl;
    }